

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::FboTestUtil::DepthGradientShader::shadeFragments(DepthGradientShader *this)

{
  FragmentShadingContext *in_RCX;
  int in_EDX;
  FragmentPacket *in_RSI;
  
  shadeFragments((DepthGradientShader *)
                 &this[-1].super_ShaderProgram.m_uniforms.
                  super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,in_RSI,in_EDX,in_RCX);
  return;
}

Assistant:

void DepthGradientShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const float			gradientMin	(u_minGradient.value.f);
	const float			gradientMax	(u_maxGradient.value.f);
	const tcu::Vec4		color		(u_color.value.f4);
	const tcu::IVec4	icolor		(castVectorSaturate<deInt32>(color));
	const tcu::UVec4	uicolor		(castVectorSaturate<deUint32>(color));

	// running this shader without a depth buffer does not make any sense
	DE_ASSERT(context.fragmentDepths);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec4		coord	= rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
		const float			x		= coord.x();
		const float			y		= coord.y();
		const float			f0		= (x + y) * 0.5f;

		rr::writeFragmentDepth(context, packetNdx, fragNdx, 0, gradientMin + (gradientMax-gradientMin) * f0);

		if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
		else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
		else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
		else
			DE_ASSERT(DE_FALSE);
	}
}